

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O2

BrandInitializerText * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeBrandInitializers
          (BrandInitializerText *__return_storage_ptr__,CapnpcCppMain *this,
          TemplateContext *templateContext,Schema schema)

{
  _Rb_tree_color _Var1;
  size_t sVar2;
  _Base_ptr p_Var3;
  char *schema_00;
  map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
  *depMap_00;
  char *in_R8;
  Array<kj::StringTree> local_150;
  ArrayBuilder<kj::StringTree> scopes;
  ArrayPtr<const_char> local_108;
  CapnpcCppMain *local_f8;
  TemplateContext *local_f0;
  Vector<kj::StringTree> bindings;
  map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
  depMap;
  map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
  scopeMap;
  Reader param;
  
  TemplateContext::getScopeMap(&scopeMap,templateContext);
  sVar2 = scopeMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
  scopes.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>
                         (scopeMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  scopes.endPtr = scopes.ptr + sVar2;
  scopes.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  scopes.pos = scopes.ptr;
  local_f8 = this;
  local_f0 = (TemplateContext *)schema.raw;
  bindings.builder.ptr =
       kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>
                 (scopeMap._M_t._M_impl.super__Rb_tree_header._M_node_count * 2);
  schema_00 = (char *)(bindings.builder.ptr +
                      scopeMap._M_t._M_impl.super__Rb_tree_header._M_node_count * 2);
  bindings.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  bindings.builder.pos = bindings.builder.ptr;
  bindings.builder.endPtr = (StringTree *)schema_00;
  for (p_Var3 = scopeMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &scopeMap._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    kj::hex((CappedArray<char,_17UL> *)&param,*(unsigned_long *)(p_Var3 + 1));
    local_150.ptr = (StringTree *)(((long)bindings.builder.pos - (long)bindings.builder.ptr) / 0x38)
    ;
    local_108.ptr._0_4_ = p_Var3[2]._M_color;
    in_R8 = ", brandBindings + ";
    schema_00 = (char *)&param;
    kj::
    strTree<char_const(&)[5],char_const(&)[3],kj::CappedArray<char,17ul>,char_const(&)[19],unsigned_long,char_const(&)[3],unsigned_int,char_const(&)[11]>
              ((StringTree *)&depMap,(kj *)"  { ",(char (*) [5])0x23fdaa,(char (*) [3])&param,
               (CappedArray<char,_17UL> *)", brandBindings + ",(char (*) [19])&local_150,
               (unsigned_long *)0x241176,(char (*) [3])&local_108,(uint *)", false},\n",
               (char (*) [11])0x38);
    kj::StringTree::StringTree(scopes.pos,(StringTree *)&depMap);
    scopes.pos = scopes.pos + 1;
    kj::StringTree::~StringTree((StringTree *)&depMap);
    local_150.size_._0_4_ = _S_red;
    _Var1 = p_Var3[2]._M_color;
    local_150.ptr = (StringTree *)&p_Var3[1]._M_parent;
    for (; (_Rb_tree_color)local_150.size_ != _Var1;
        local_150.size_._0_4_ = (_Rb_tree_color)local_150.size_ + _S_black) {
      _::
      IndexingIterator<const_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_capnp::schema::Node::Parameter::Reader>
      ::operator*(&param,(IndexingIterator<const_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_capnp::schema::Node::Parameter::Reader>
                          *)&local_150);
      local_108 = (ArrayPtr<const_char>)
                  capnp::schema::Node::Parameter::Reader::getName((Reader *)&param);
      schema_00 = ">(),\n";
      kj::strTree<char_const(&)[31],capnp::Text::Reader,char_const(&)[6]>
                ((StringTree *)&depMap,(kj *)"  ::capnp::_::brandBindingFor<",
                 (char (*) [31])&local_108,(Reader *)">(),\n",(char (*) [6])in_R8);
      kj::Vector<kj::StringTree>::add<kj::StringTree>(&bindings,(StringTree *)&depMap);
      kj::StringTree::~StringTree((StringTree *)&depMap);
    }
  }
  makeBrandDepMap(&depMap,local_f8,local_f0,(Schema)schema_00);
  param._reader.capTable = (CapTableReader *)(((long)scopes.pos - (long)scopes.ptr) / 0x38);
  param._reader.segment = (SegmentReader *)scopes.ptr;
  param._reader.data = scopes.disposer;
  scopes.ptr = (StringTree *)0x0;
  scopes.pos = (RemoveConst<kj::StringTree> *)0x0;
  scopes.endPtr = (StringTree *)0x0;
  kj::strTree<char_const(&)[3],kj::Array<kj::StringTree>,char_const(&)[2]>
            (&__return_storage_ptr__->scopes,(kj *)0x240ef9,(char (*) [3])&param,
             (Array<kj::StringTree> *)"}",(char (*) [2])in_R8);
  kj::Vector<kj::StringTree>::releaseAsArray(&local_150,&bindings);
  kj::strTree<char_const(&)[3],kj::Array<kj::StringTree>,char_const(&)[2]>
            (&__return_storage_ptr__->bindings,(kj *)0x240ef9,(char (*) [3])&local_150,
             (Array<kj::StringTree> *)"}",(char (*) [2])in_R8);
  makeBrandDepInitializers(&__return_storage_ptr__->dependencies,(CapnpcCppMain *)&depMap,depMap_00)
  ;
  __return_storage_ptr__->dependencyCount = depMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
  kj::Array<kj::StringTree>::~Array(&local_150);
  kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)&param);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_kj::StringTree>,_std::_Select1st<std::pair<const_unsigned_int,_kj::StringTree>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
  ::~_Rb_tree(&depMap._M_t);
  kj::ArrayBuilder<kj::StringTree>::dispose(&bindings.builder);
  kj::ArrayBuilder<kj::StringTree>::dispose(&scopes);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>,_std::_Select1st<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
  ::~_Rb_tree(&scopeMap._M_t);
  return __return_storage_ptr__;
}

Assistant:

BrandInitializerText makeBrandInitializers(
      const TemplateContext& templateContext, Schema schema) {
    auto scopeMap = templateContext.getScopeMap();

    auto scopes = kj::heapArrayBuilder<kj::StringTree>(scopeMap.size());
    kj::Vector<kj::StringTree> bindings(scopeMap.size() * 2);  // (estimate two params per scope)

    for (auto& scope: scopeMap) {
      scopes.add(kj::strTree("  { ",
        "0x", kj::hex(scope.first), ", "
        "brandBindings + ", bindings.size(), ", ",
        scope.second.size(), ", "
        "false"
      "},\n"));

      for (auto param: scope.second) {
        bindings.add(kj::strTree("  ::capnp::_::brandBindingFor<", param.getName(), ">(),\n"));
      }
    }

    auto depMap = makeBrandDepMap(templateContext, schema);
    auto dependencyCount = depMap.size();
    return {
      kj::strTree("{\n", scopes.finish(), "}"),
      kj::strTree("{\n", bindings.releaseAsArray(), "}"),
      makeBrandDepInitializers(kj::mv(depMap)),
      dependencyCount
    };
  }